

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

void __thiscall Diligent::PipelineStateGLImpl::Destruct(PipelineStateGLImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  RenderDeviceGLImpl *this_01;
  long lVar2;
  ulong uVar3;
  
  this_01 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)this);
  RenderDeviceGLImpl::OnDestroyPSO(this_01,this);
  if (this->m_GLPrograms != (SharedGLProgramPtr *)0x0) {
    bVar1 = this->m_NumPrograms;
    if (bVar1 != 0) {
      lVar2 = 8;
      uVar3 = 0;
      do {
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(this->m_GLPrograms->
                           super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar2);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          bVar1 = this->m_NumPrograms;
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar3 < bVar1);
    }
    this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  }
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_NumPrograms = '\0';
  PipelineStateBase<Diligent::EngineGLImplTraits>::Destruct
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  return;
}

Assistant:

void PipelineStateGLImpl::Destruct()
{
    GetDevice()->OnDestroyPSO(*this);

    if (m_GLPrograms)
    {
        for (Uint32 i = 0; i < m_NumPrograms; ++i)
        {
            m_GLPrograms[i].~SharedGLProgramPtr();
        }
        m_GLPrograms = nullptr;
    }

    m_ShaderTypes = nullptr;
    m_NumPrograms = 0;

    TPipelineStateBase::Destruct();
}